

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QPodArrayOps<QGraphicsItemAnimationPrivate::Pair>::insert
          (QPodArrayOps<QGraphicsItemAnimationPrivate::Pair> *this,qsizetype i,qsizetype n,
          parameter_type t)

{
  qreal qVar1;
  qreal qVar2;
  Pair *pPVar3;
  GrowthPosition where;
  
  qVar1 = t->step;
  qVar2 = t->value;
  where = (GrowthPosition)
          (i == 0 && (this->super_QArrayDataPointer<QGraphicsItemAnimationPrivate::Pair>).size != 0)
  ;
  QArrayDataPointer<QGraphicsItemAnimationPrivate::Pair>::detachAndGrow
            (&this->super_QArrayDataPointer<QGraphicsItemAnimationPrivate::Pair>,where,n,
             (Pair **)0x0,(QArrayDataPointer<QGraphicsItemAnimationPrivate::Pair> *)0x0);
  pPVar3 = createHole(this,where,i,n);
  if (n != 0) {
    do {
      pPVar3->step = qVar1;
      pPVar3->value = qVar2;
      pPVar3 = pPVar3 + 1;
      n = n + -1;
    } while (n != 0);
  }
  return;
}

Assistant:

void insert(qsizetype i, qsizetype n, parameter_type t)
    {
        T copy(t);

        typename Data::GrowthPosition pos = Data::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = Data::GrowsAtBeginning;

        this->detachAndGrow(pos, n, nullptr, nullptr);
        Q_ASSERT((pos == Data::GrowsAtBeginning && this->freeSpaceAtBegin() >= n) ||
                 (pos == Data::GrowsAtEnd && this->freeSpaceAtEnd() >= n));

        T *where = createHole(pos, i, n);
        while (n--)
            *where++ = copy;
    }